

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_mtdf.c
# Opt level: O3

short SEARCH_mtdf(chess_state_t *s,search_state_t *search_state,uchar depth,move_t *move,short guess
                 )

{
  uint uVar1;
  short beta;
  undefined7 in_register_00000011;
  uint uVar2;
  uint uVar3;
  int iVar4;
  move_t movetemp;
  chess_state_t state;
  move_t local_dc;
  pv_line_t *local_d8;
  pv_line_t *local_d0;
  move_t *local_c8;
  chess_state_t local_c0;
  
  local_c8 = move;
  memcpy(&local_c0,s,0x90);
  local_c0.last_move = 0;
  iVar4 = (int)CONCAT71(in_register_00000011,depth);
  uVar3 = -iVar4 - 0x3e9;
  uVar2 = iVar4 + 0x3e9;
  local_d0 = search_state->pv_table;
  local_d8 = &search_state->pv;
  do {
    if ((short)uVar2 <= (short)(ushort)uVar3) {
      return guess;
    }
    beta = (ushort)(guess == (ushort)uVar3) + guess;
    guess = SEARCH_nullwindow(&local_c0,search_state,depth,'\0',&local_dc,beta);
    uVar1 = (uint)(ushort)guess;
    if (beta <= guess) {
      *local_c8 = local_dc;
      iVar4 = search_state->pv_table[0].size;
      (search_state->pv).size = iVar4;
      memcpy(local_d8,local_d0,(long)iVar4 << 2);
      uVar3 = (uint)(ushort)guess;
      uVar1 = uVar2;
    }
    uVar2 = uVar1;
  } while (search_state->abort_search == 0);
  return 0;
}

Assistant:

short SEARCH_mtdf(const chess_state_t *s, search_state_t *search_state, const unsigned char depth, move_t *move, short guess)
{
    short bounds[2];
    short beta;
    move_t movetemp;
    chess_state_t state = *s;
    
    /* Trick to disable null-move pruning on the first level of search */
    state.last_move = 0;
    
    bounds[0] = SEARCH_MIN_RESULT(depth+1);
    bounds[1] = SEARCH_MAX_RESULT(depth+1);
    
    while(bounds[0] < bounds[1]) {
        if(guess == bounds[0]) {
            beta = guess + 1;
        } else {
            beta = guess;
        }

        guess = SEARCH_nullwindow(&state, search_state, depth, 0, &movetemp, beta);

        if(guess < beta) {
            bounds[1] = guess;
        } else {
            bounds[0] = guess;
            *move = movetemp;
            search_state->pv.size = search_state->pv_table[0].size;
            memcpy(search_state->pv.moves, search_state->pv_table[0].moves, search_state->pv.size * sizeof(move_t));
        }
        
        if(search_state->abort_search) {
            return 0;
        }
    }
    
    return guess;
}